

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

void icetSingleImageCollect
               (IceTSparseImage input_image,IceTInt dest,IceTSizeType piece_offset,
               IceTImage result_image)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  IceTEnum IVar4;
  IceTEnum IVar5;
  IceTSizeType *recvoffsets;
  IceTSizeType *recvcounts;
  IceTVoid *pIVar6;
  ulong uVar7;
  IceTSizeType IVar8;
  IceTVoid *pIVar9;
  IceTSizeType *recvcounts_00;
  IceTSizeType *recvoffsets_00;
  IceTSizeType color_size;
  IceTSizeType depth_size;
  IceTSizeType piece_size;
  IceTByte dummy_buffer [64];
  IceTSizeType local_94;
  IceTSizeType local_90;
  IceTSizeType local_8c;
  IceTSizeType local_88;
  int local_84;
  ulong local_80;
  undefined1 local_78 [72];
  
  local_94 = 1;
  local_8c = 1;
  recvcounts = (IceTSizeType *)0x0;
  local_90 = piece_offset;
  iVar2 = icetCommRank();
  uVar3 = icetCommSize();
  local_88 = icetSparseImageGetNumPixels(input_image);
  local_84 = iVar2;
  local_80 = (ulong)uVar3;
  if (iVar2 == dest) {
    recvoffsets = (IceTSizeType *)icetGetStateBuffer(0x186,uVar3 * 4);
    recvcounts = (IceTSizeType *)icetGetStateBuffer(0x187,uVar3 * 4);
  }
  else {
    recvoffsets = (IceTSizeType *)0x0;
  }
  icetCommGather(&local_90,1,0x8003,recvoffsets,dest);
  icetCommGather(&local_88,1,0x8003,recvcounts,dest);
  if (local_88 < 1) {
    if (local_84 != dest) {
      IVar8 = icetImageBufferSize(0,0);
      if (0x40 < IVar8) {
        icetRaiseDiagnostic("Oops.  My dummy buffer is not big enough.",0xffffffff,1,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/strategies/common.c"
                            ,0x200);
        return;
      }
      result_image = icetImageAssignBuffer(local_78,0,0);
    }
  }
  else {
    icetDecompressSubImage(input_image,local_90,result_image);
  }
  icetImageAdjustForOutput(result_image);
  icetTimingCollectBegin();
  IVar4 = icetImageGetColorFormat(result_image);
  IVar5 = icetImageGetDepthFormat(result_image);
  iVar2 = local_84;
  if (IVar4 != 0xc000) {
    pIVar6 = icetImageGetColorVoid(result_image,&local_94);
    if (iVar2 == dest) {
      if (0 < (int)local_80) {
        uVar7 = 0;
        do {
          recvoffsets[uVar7] = recvoffsets[uVar7] * local_94;
          recvcounts[uVar7] = recvcounts[uVar7] * local_94;
          uVar7 = uVar7 + 1;
        } while ((local_80 & 0xffffffff) != uVar7);
      }
      IVar8 = recvcounts[iVar2];
      pIVar9 = (void *)0xffffffffffffffff;
      recvcounts_00 = recvcounts;
      recvoffsets_00 = recvoffsets;
    }
    else {
      pIVar9 = (IceTVoid *)((long)pIVar6 + (long)local_90 * (long)local_94);
      IVar8 = local_88 * local_94;
      pIVar6 = (void *)0x0;
      recvcounts_00 = (IceTSizeType *)0x0;
      recvoffsets_00 = (IceTSizeType *)0x0;
    }
    icetCommGatherv(pIVar9,IVar8,0x8001,pIVar6,recvcounts_00,recvoffsets_00,dest);
  }
  if (IVar5 != 0xd000) {
    pIVar6 = icetImageGetDepthVoid(result_image,&local_8c);
    if (iVar2 == dest) {
      if (0 < (int)local_80 && local_94 != local_8c) {
        uVar7 = 0;
        do {
          iVar1 = recvoffsets[uVar7];
          recvoffsets[uVar7] = iVar1 / local_94;
          recvoffsets[uVar7] = (iVar1 / local_94) * local_8c;
          iVar1 = recvcounts[uVar7];
          recvcounts[uVar7] = iVar1 / local_94;
          recvcounts[uVar7] = (iVar1 / local_94) * local_8c;
          uVar7 = uVar7 + 1;
        } while ((local_80 & 0xffffffff) != uVar7);
      }
      IVar8 = recvcounts[iVar2];
      pIVar9 = (void *)0xffffffffffffffff;
    }
    else {
      pIVar9 = (IceTVoid *)((long)pIVar6 + (long)local_90 * (long)local_8c);
      IVar8 = local_88 * local_8c;
      pIVar6 = (void *)0x0;
      recvcounts = (IceTSizeType *)0x0;
      recvoffsets = (IceTSizeType *)0x0;
    }
    icetCommGatherv(pIVar9,IVar8,0x8001,pIVar6,recvcounts,recvoffsets,dest);
  }
  icetTimingCollectEnd();
  return;
}

Assistant:

void icetSingleImageCollect(const IceTSparseImage input_image,
                            IceTInt dest,
                            IceTSizeType piece_offset,
                            IceTImage result_image)
{
    IceTSizeType *offsets;
    IceTSizeType *sizes;
    IceTInt rank;
    IceTInt numproc;

    IceTSizeType piece_size;

    IceTEnum color_format;
    IceTEnum depth_format;
    IceTSizeType color_size = 1;
    IceTSizeType depth_size = 1;

#define DUMMY_BUFFER_SIZE       ((IceTSizeType)(16*sizeof(IceTInt)))
    IceTByte dummy_buffer[DUMMY_BUFFER_SIZE];

    rank = icetCommRank();
    numproc = icetCommSize();

    /* Collect partitions held by each process. */
    piece_size = icetSparseImageGetNumPixels(input_image);
    if (rank == dest) {
        offsets = icetGetStateBuffer(ICET_IMAGE_COLLECT_OFFSET_BUF,
                                     sizeof(IceTSizeType)*numproc);
        sizes = icetGetStateBuffer(ICET_IMAGE_COLLECT_SIZE_BUF,
                                   sizeof(IceTSizeType)*numproc);
    } else {
        offsets = NULL;
        sizes = NULL;
    }
    /* Technically, these gathers are part of the collection process and should
       therefore be timed.  However, unless the compositing is very well load
       balanced (and typically it is not), different processes will arrive here
       at different times.  These gathers act something like a barrier that
       helps separate the time spent collecting final pixels from the time spent
       in transferring and compositing fragments. */
    icetCommGather(&piece_offset, 1, ICET_SIZE_TYPE, offsets, dest);
    icetCommGather(&piece_size, 1, ICET_SIZE_TYPE, sizes, dest);

#ifdef DEBUG
    if (rank == dest) {
        IceTVoid *data;
        IceTSizeType size;
        if (icetImageGetColorFormat(result_image) != ICET_IMAGE_COLOR_NONE) {
            data = icetImageGetColorVoid(result_image, &size);
            memset(data, 0xCD, icetImageGetNumPixels(result_image)*size);
        }
        if (icetImageGetDepthFormat(result_image) != ICET_IMAGE_DEPTH_NONE) {
            data = icetImageGetDepthVoid(result_image, &size);
            memset(data, 0xCD, icetImageGetNumPixels(result_image)*size);
        }
    }
#endif

    if (piece_size > 0) {
        /* Decompress data into appropriate offset of result image. */
        icetDecompressSubImage(input_image, piece_offset, result_image);
    } else if (rank != dest) {
        /* If this function is called for multiple collections, it is likely
           that the local process will not have data for all collections.  To
           prevent making the calling function allocate an image buffer when it
           is neither sending or receiving data, just allocate a dummy buffer to
           satisfy the following code. */
        if (DUMMY_BUFFER_SIZE < icetImageBufferSize(0, 0)) {
            icetRaiseError("Oops.  My dummy buffer is not big enough.",
                           ICET_SANITY_CHECK_FAIL);
            return;
        }
        result_image = icetImageAssignBuffer(dummy_buffer, 0, 0);
    } else {
        /* Collecting data at empty process.  We still want to use the provided
           result_image, but we have nothing of our own to put in it.  Thus, do
           nothing. */
    }

    /* Adjust image for output as some buffers, such as depth, might be
       dropped. */
    icetImageAdjustForOutput(result_image);

    icetTimingCollectBegin();

    color_format = icetImageGetColorFormat(result_image);
    depth_format = icetImageGetDepthFormat(result_image);

    if (color_format != ICET_IMAGE_COLOR_NONE) {
        /* Use IceTByte for byte-based pointer arithmetic. */
        IceTByte *color_buffer
          = icetImageGetColorVoid(result_image, &color_size);
        int proc;

        if (rank == dest) {
            /* Adjust sizes and offsets to sizes of pixel colors. */
            for (proc = 0; proc < numproc; proc++) {
                offsets[proc] *= color_size;
                sizes[proc] *= color_size;
            }
            icetCommGatherv(ICET_IN_PLACE_COLLECT,
                            sizes[rank],
                            ICET_BYTE,
                            color_buffer,
                            sizes,
                            offsets,
                            dest);
        } else {
            icetCommGatherv(color_buffer + piece_offset * color_size,
                            piece_size * color_size,
                            ICET_BYTE,
                            NULL,
                            NULL,
                            NULL,
                            dest);
        }
    }

    if (depth_format != ICET_IMAGE_DEPTH_NONE) {
        /* Use IceTByte for byte-based pointer arithmetic. */
        IceTByte *depth_buffer
          = icetImageGetDepthVoid(result_image, &depth_size);
        int proc;

        if (rank == dest) {
            /* Adjust sizes and offsets to sizes of pixel depths.  Also
               adjust for any adjustments made for color. */
            if (color_size != depth_size) {
                for (proc = 0; proc < numproc; proc++) {
                    offsets[proc] /= color_size;
                    offsets[proc] *= depth_size;
                    sizes[proc] /= color_size;
                    sizes[proc] *= depth_size;
                }
            }
            icetCommGatherv(ICET_IN_PLACE_COLLECT,
                            sizes[rank],
                            ICET_BYTE,
                            depth_buffer,
                            sizes,
                            offsets,
                            dest);
        } else {
            icetCommGatherv(depth_buffer + piece_offset * depth_size,
                            piece_size * depth_size,
                            ICET_BYTE,
                            NULL,
                            NULL,
                            NULL,
                            dest);
        }
    }

    icetTimingCollectEnd();
}